

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_perspective(vec4 *m,float y_fov,float aspect,float n,float f)

{
  double dVar1;
  float a;
  float f_local;
  float n_local;
  float aspect_local;
  float y_fov_local;
  vec4 *m_local;
  
  dVar1 = tan((double)(y_fov / 2.0));
  (*m)[0] = (1.0 / (float)dVar1) / aspect;
  (*m)[1] = 0.0;
  (*m)[2] = 0.0;
  (*m)[3] = 0.0;
  m[1][0] = 0.0;
  m[1][1] = 1.0 / (float)dVar1;
  m[1][2] = 0.0;
  m[1][3] = 0.0;
  m[2][0] = 0.0;
  m[2][1] = 0.0;
  m[2][2] = -((f + n) / (f - n));
  m[2][3] = -1.0;
  m[3][0] = 0.0;
  m[3][1] = 0.0;
  m[3][2] = -((f * 2.0 * n) / (f - n));
  m[3][3] = 0.0;
  return;
}

Assistant:

static inline void mat4x4_perspective(mat4x4 m, float y_fov, float aspect, float n, float f)
{
	/* NOTE: Degrees are an unhandy unit to work with.
	 * linmath.h uses radians for everything! */
	float const a = 1.f / (float) tan(y_fov / 2.f);

	m[0][0] = a / aspect;
	m[0][1] = 0.f;
	m[0][2] = 0.f;
	m[0][3] = 0.f;

	m[1][0] = 0.f;
	m[1][1] = a;
	m[1][2] = 0.f;
	m[1][3] = 0.f;

	m[2][0] = 0.f;
	m[2][1] = 0.f;
	m[2][2] = -((f + n) / (f - n));
	m[2][3] = -1.f;

	m[3][0] = 0.f;
	m[3][1] = 0.f;
	m[3][2] = -((2.f * f * n) / (f - n));
	m[3][3] = 0.f;
}